

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::convertToXYZFloat
               (float *out,float *whitepoint,float *in,uint w,uint h,LodePNGState *state)

{
  long in_R9;
  LodePNGICC icc;
  uint use_icc;
  LodePNGInfo *info;
  uint error;
  uint in_stack_fffffffffffffeb4;
  LodePNGInfo *in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  float *in_stack_fffffffffffffec8;
  float *in_stack_fffffffffffffed0;
  LodePNGICC *in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  LodePNGInfo *in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float *in_stack_fffffffffffffef8;
  uchar *in_stack_ffffffffffffff00;
  LodePNGICC *in_stack_ffffffffffffff08;
  float *in_stack_ffffffffffffff10;
  uint local_2c;
  
  local_2c = 0;
  lodepng_icc_init((LodePNGICC *)0x14150c);
  if (*(int *)(in_R9 + 0x1a8) != 0) {
    local_2c = parseICC(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                        (size_t)in_stack_fffffffffffffef8);
    if (local_2c != 0) goto LAB_001415e5;
    validateICC((LodePNGICC *)&stack0xfffffffffffffe98);
  }
  convertToXYZ_gamma(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (uint)in_stack_fffffffffffffec4,(uint)in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                     (LodePNGICC *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  convertToXYZ_chrm(in_stack_fffffffffffffef8,(uint)in_stack_fffffffffffffef4,
                    (uint)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                    (uint)in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                    in_stack_ffffffffffffff10);
LAB_001415e5:
  lodepng_icc_cleanup((LodePNGICC *)0x1415ef);
  return local_2c;
}

Assistant:

unsigned convertToXYZFloat(float* out, float whitepoint[3], const float* in,
                           unsigned w, unsigned h, const LodePNGState* state) {
  unsigned error = 0;
  const LodePNGInfo* info = &state->info_png;

  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }
  /* Input is floating point, so lookup table cannot be used, but it's ensured to
  use float pow, not the slower double pow. */
  convertToXYZ_gamma(out, in, w, h, info, use_icc, &icc);
  convertToXYZ_chrm(out, w, h, info, use_icc, &icc, whitepoint);

cleanup:
  lodepng_icc_cleanup(&icc);
  return error;
}